

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_add(m2v *A,m2v *B,m2v *out)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  m2v_base *pmVar4;
  m2v_base *pmVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < A->n_row) {
    uVar8 = (ulong)(uint)out->row_stride;
    iVar6 = 0;
    do {
      iVar7 = (int)uVar8;
      if (0 < iVar7) {
        iVar2 = A->row_stride;
        pmVar4 = out->e;
        pmVar5 = A->e;
        lVar9 = 0;
        do {
          pmVar4[(ulong)(uint)(iVar7 * iVar6) + lVar9] = pmVar5[(long)iVar2 * (long)iVar6 + lVar9];
          lVar9 = lVar9 + 1;
          iVar3 = out->row_stride;
          uVar8 = (ulong)iVar3;
        } while (lVar9 < (long)uVar8);
        if (0 < iVar3) {
          iVar7 = B->row_stride;
          pmVar5 = B->e;
          lVar9 = 0;
          do {
            puVar1 = pmVar4 + (ulong)(uint)(iVar3 * iVar6) + lVar9;
            *puVar1 = *puVar1 ^ pmVar5[(long)iVar7 * (long)iVar6 + lVar9];
            lVar9 = lVar9 + 1;
            uVar8 = (ulong)out->row_stride;
          } while (lVar9 < (long)uVar8);
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < A->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_add)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* out)
{
	assert(A->n_row == B->n_row);
	assert(A->n_col == B->n_col);
	assert(A->n_row == out->n_row);
	assert(A->n_col == out->n_col);

	for (int i = 0; i < A->n_row; ++i) {
		MV_GEN_N(_copy_row)(A, i, out, i);
		MV_GEN_N(_multadd_row)(B, i, 1, out, i);
	}
}